

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::BuildEnum
          (DescriptorBuilder *this,EnumDescriptorProto *proto,Descriptor *parent,
          EnumDescriptor *result)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int32 iVar4;
  int32 iVar5;
  ErrorLocation location;
  int iVar6;
  int iVar7;
  string *psVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **ppbVar9;
  EnumDescriptor *in_RCX;
  Descriptor *in_RDX;
  SubstituteArg *in_RSI;
  long in_RDI;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar10;
  ReservedRange *range;
  int j_1;
  EnumValueDescriptor *value;
  int i_5;
  string *name;
  int i_4;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  reserved_name_set;
  EnumDescriptorProto_EnumReservedRange *range2;
  int j;
  EnumDescriptorProto_EnumReservedRange *range1;
  int i_3;
  int i_2;
  int reserved_name_count;
  int i_1;
  int i;
  string *full_name;
  string *scope;
  ReservedRange *in_stack_fffffffffffff538;
  SubstituteArg *this_00;
  Tables *in_stack_fffffffffffff540;
  anon_union_8_8_13f84498_for_Symbol_2 this_01;
  SubstituteArg *in_stack_fffffffffffff548;
  DescriptorBuilder *in_stack_fffffffffffff550;
  string *in_stack_fffffffffffff558;
  Tables *in_stack_fffffffffffff560;
  undefined8 in_stack_fffffffffffff578;
  EnumDescriptor *in_stack_fffffffffffff580;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  in_stack_fffffffffffff588;
  DescriptorBuilder *in_stack_fffffffffffff590;
  undefined4 in_stack_fffffffffffff598;
  int in_stack_fffffffffffff59c;
  SubstituteArg *in_stack_fffffffffffff5a0;
  EnumDescriptorProto_EnumReservedRange *in_stack_fffffffffffff5a8;
  Message *in_stack_fffffffffffff5b0;
  undefined4 in_stack_fffffffffffff5b8;
  undefined4 in_stack_fffffffffffff5bc;
  undefined4 in_stack_fffffffffffff5c0;
  undefined4 in_stack_fffffffffffff5c4;
  string *in_stack_fffffffffffff5c8;
  undefined4 in_stack_fffffffffffff5d0;
  undefined4 in_stack_fffffffffffff5d4;
  undefined4 in_stack_fffffffffffff5e0;
  undefined4 in_stack_fffffffffffff5e4;
  SubstituteArg *in_stack_fffffffffffff5e8;
  SubstituteArg *in_stack_fffffffffffff5f0;
  undefined7 in_stack_fffffffffffff5f8;
  undefined1 in_stack_fffffffffffff5ff;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  in_stack_fffffffffffff600;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  in_stack_fffffffffffff608;
  SubstituteArg *in_stack_fffffffffffff610;
  ErrorLocation in_stack_fffffffffffff61c;
  DescriptorBuilder *in_stack_fffffffffffff620;
  SubstituteArg *in_stack_fffffffffffff628;
  anon_union_8_8_13f84498_for_Symbol_2 in_stack_fffffffffffff630;
  string *local_938;
  SubstituteArg local_928;
  SubstituteArg local_8f8;
  EnumValueDescriptor *in_stack_fffffffffffff758;
  EnumDescriptor *in_stack_fffffffffffff760;
  EnumDescriptorProto *in_stack_fffffffffffff768;
  DescriptorBuilder *in_stack_fffffffffffff770;
  undefined1 local_868 [32];
  Message *in_stack_fffffffffffff7b8;
  string *in_stack_fffffffffffff7c0;
  char *in_stack_fffffffffffff7c8;
  string *in_stack_fffffffffffff7d0;
  DescriptorBuilder *in_stack_fffffffffffff7d8;
  Symbol in_stack_fffffffffffff7f0;
  SubstituteArg local_7d8;
  SubstituteArg local_7a8 [2];
  string local_748 [32];
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_728;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_720;
  SubstituteArg local_718;
  SubstituteArg local_6e8;
  SubstituteArg local_6b8;
  SubstituteArg local_688;
  SubstituteArg local_658;
  SubstituteArg local_628;
  SubstituteArg local_5f8;
  SubstituteArg local_5c8 [3];
  string local_538 [32];
  ReservedRange *local_518;
  int local_50c;
  EnumValueDescriptor *local_508;
  int local_4fc;
  SubstituteArg local_4f8;
  SubstituteArg local_4c8;
  undefined1 local_498 [96];
  SubstituteArg local_438;
  SubstituteArg local_408;
  SubstituteArg local_3d8;
  SubstituteArg local_3a8;
  SubstituteArg local_378 [2];
  string local_318 [32];
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_2f8;
  undefined1 local_2f0;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_2e8;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_2e0;
  SubstituteArg *local_2d8;
  int local_2cc;
  SubstituteArg local_280;
  SubstituteArg local_250;
  undefined1 local_220 [96];
  undefined1 local_1c0 [48];
  SubstituteArg local_190 [5];
  string local_a0 [32];
  EnumDescriptorProto_EnumReservedRange *local_80;
  int local_74;
  EnumDescriptorProto_EnumReservedRange *local_70;
  int local_64;
  SubstituteArg *local_60;
  anon_union_8_8_13f84498_for_Symbol_2 local_58;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  string *local_40;
  string *local_38;
  EnumDescriptor *local_30;
  Descriptor *local_28;
  SubstituteArg *local_20;
  
  local_30 = in_RCX;
  local_28 = in_RDX;
  local_20 = in_RSI;
  if (in_RDX == (Descriptor *)0x0) {
    local_938 = FileDescriptor::package_abi_cxx11_(*(FileDescriptor **)(in_RDI + 0x58));
  }
  else {
    local_938 = Descriptor::full_name_abi_cxx11_(in_RDX);
  }
  local_38 = local_938;
  EnumDescriptorProto::name_abi_cxx11_((EnumDescriptorProto *)0x633c22);
  local_40 = AllocateNameString((DescriptorBuilder *)in_stack_fffffffffffff600._M_cur,
                                (string *)
                                CONCAT17(in_stack_fffffffffffff5ff,in_stack_fffffffffffff5f8),
                                (string *)in_stack_fffffffffffff5f0);
  EnumDescriptorProto::name_abi_cxx11_((EnumDescriptorProto *)0x633c4f);
  ValidateSymbolName((DescriptorBuilder *)
                     CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
                     in_stack_fffffffffffff5c8,
                     (string *)CONCAT44(in_stack_fffffffffffff5c4,in_stack_fffffffffffff5c0),
                     (Message *)CONCAT44(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8));
  EnumDescriptorProto::name_abi_cxx11_((EnumDescriptorProto *)0x633c90);
  psVar8 = DescriptorPool::Tables::AllocateString
                     (in_stack_fffffffffffff560,in_stack_fffffffffffff558);
  *(string **)local_30 = psVar8;
  *(string **)(local_30 + 8) = local_40;
  *(undefined8 *)(local_30 + 0x10) = *(undefined8 *)(in_RDI + 0x58);
  *(Descriptor **)(local_30 + 0x18) = local_28;
  local_30[0x28] = (EnumDescriptor)0x0;
  local_30[0x29] = (EnumDescriptor)0x0;
  iVar2 = EnumDescriptorProto::value_size((EnumDescriptorProto *)0x633d13);
  if (iVar2 == 0) {
    EnumDescriptor::full_name_abi_cxx11_(local_30);
    AddError((DescriptorBuilder *)CONCAT44(in_stack_fffffffffffff5c4,in_stack_fffffffffffff5c0),
             (string *)CONCAT44(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8),
             in_stack_fffffffffffff5b0,(ErrorLocation)((ulong)in_stack_fffffffffffff5a8 >> 0x20),
             (char *)in_stack_fffffffffffff5a0);
  }
  iVar2 = EnumDescriptorProto::value_size((EnumDescriptorProto *)0x633d53);
  *(int *)(local_30 + 0x2c) = iVar2;
  EnumDescriptorProto::value_size((EnumDescriptorProto *)0x633d6d);
  AllocateArray<google::protobuf::EnumValueDescriptor>
            ((DescriptorBuilder *)in_stack_fffffffffffff540,
             (int)((ulong)in_stack_fffffffffffff538 >> 0x20),(EnumValueDescriptor **)0x633d88);
  for (local_44 = 0; iVar2 = local_44,
      iVar3 = EnumDescriptorProto::value_size((EnumDescriptorProto *)0x633dae), iVar2 < iVar3;
      local_44 = local_44 + 1) {
    EnumDescriptorProto::value
              ((EnumDescriptorProto *)in_stack_fffffffffffff540,
               (int)((ulong)in_stack_fffffffffffff538 >> 0x20));
    BuildEnumValue(in_stack_fffffffffffff770,(EnumValueDescriptorProto *)in_stack_fffffffffffff768,
                   in_stack_fffffffffffff760,in_stack_fffffffffffff758);
  }
  iVar2 = EnumDescriptorProto::reserved_range_size((EnumDescriptorProto *)0x633e25);
  *(int *)(local_30 + 0x38) = iVar2;
  EnumDescriptorProto::reserved_range_size((EnumDescriptorProto *)0x633e3f);
  AllocateArray<google::protobuf::EnumDescriptor::ReservedRange>
            ((DescriptorBuilder *)in_stack_fffffffffffff540,
             (int)((ulong)in_stack_fffffffffffff538 >> 0x20),(ReservedRange **)0x633e5a);
  for (local_48 = 0; iVar2 = local_48,
      iVar3 = EnumDescriptorProto::reserved_range_size((EnumDescriptorProto *)0x633e80),
      iVar2 < iVar3; local_48 = local_48 + 1) {
    EnumDescriptorProto::reserved_range
              ((EnumDescriptorProto *)in_stack_fffffffffffff540,
               (int)((ulong)in_stack_fffffffffffff538 >> 0x20));
    BuildReservedRange(in_stack_fffffffffffff550,(EnumReservedRange *)in_stack_fffffffffffff548,
                       (EnumDescriptor *)in_stack_fffffffffffff540,in_stack_fffffffffffff538);
  }
  local_4c = EnumDescriptorProto::reserved_name_size((EnumDescriptorProto *)0x633ef7);
  *(int *)(local_30 + 0x3c) = local_4c;
  ppbVar9 = DescriptorPool::Tables::AllocateArray<std::__cxx11::string_const*>
                      (in_stack_fffffffffffff540,(int)((ulong)in_stack_fffffffffffff538 >> 0x20));
  *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ***)(local_30 + 0x48) =
       ppbVar9;
  for (local_50 = 0; iVar2 = (int)((ulong)in_stack_fffffffffffff578 >> 0x20), local_50 < local_4c;
      local_50 = local_50 + 1) {
    EnumDescriptorProto::reserved_name_abi_cxx11_
              ((EnumDescriptorProto *)in_stack_fffffffffffff540,
               (int)((ulong)in_stack_fffffffffffff538 >> 0x20));
    psVar8 = DescriptorPool::Tables::AllocateString
                       (in_stack_fffffffffffff560,in_stack_fffffffffffff558);
    *(string **)(*(long *)(local_30 + 0x48) + (long)local_50 * 8) = psVar8;
  }
  CheckEnumValueUniqueness
            (in_stack_fffffffffffff770,in_stack_fffffffffffff768,in_stack_fffffffffffff760);
  bVar1 = EnumDescriptorProto::has_options((EnumDescriptorProto *)0x633fe4);
  if (bVar1) {
    EnumDescriptorProto::options((EnumDescriptorProto *)0x634007);
    AllocateOptions<google::protobuf::EnumDescriptor>
              (in_stack_fffffffffffff590,(OptionsType *)in_stack_fffffffffffff588._M_cur,
               in_stack_fffffffffffff580,iVar2);
  }
  else {
    *(undefined8 *)(local_30 + 0x20) = 0;
  }
  EnumDescriptor::full_name_abi_cxx11_(local_30);
  EnumDescriptor::name_abi_cxx11_(local_30);
  Symbol::Symbol((Symbol *)&local_60,local_30);
  AddSymbol(in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8,
            in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,in_stack_fffffffffffff7f0);
  this_00 = local_60;
  this_01 = local_58;
  for (local_64 = 0; iVar2 = local_64,
      iVar3 = EnumDescriptorProto::reserved_range_size((EnumDescriptorProto *)0x6340ee),
      iVar2 < iVar3; local_64 = local_64 + 1) {
    local_70 = EnumDescriptorProto::reserved_range
                         ((EnumDescriptorProto *)this_01.descriptor,(int)((ulong)this_00 >> 0x20));
    local_74 = local_64;
    while( true ) {
      local_74 = local_74 + 1;
      iVar2 = local_74;
      iVar3 = EnumDescriptorProto::reserved_range_size((EnumDescriptorProto *)0x634147);
      if (iVar3 <= iVar2) break;
      local_80 = EnumDescriptorProto::reserved_range
                           ((EnumDescriptorProto *)this_01.descriptor,(int)((ulong)this_00 >> 0x20))
      ;
      iVar4 = EnumDescriptorProto_EnumReservedRange::end
                        ((EnumDescriptorProto_EnumReservedRange *)0x634181);
      iVar5 = EnumDescriptorProto_EnumReservedRange::start
                        ((EnumDescriptorProto_EnumReservedRange *)0x634195);
      if (iVar5 <= iVar4) {
        iVar4 = EnumDescriptorProto_EnumReservedRange::end
                          ((EnumDescriptorProto_EnumReservedRange *)0x6341b3);
        iVar5 = EnumDescriptorProto_EnumReservedRange::start
                          ((EnumDescriptorProto_EnumReservedRange *)0x6341c7);
        if (iVar5 <= iVar4) {
          EnumDescriptor::full_name_abi_cxx11_(local_30);
          iVar2 = (int)((ulong)this_00 >> 0x20);
          EnumDescriptorProto::reserved_range((EnumDescriptorProto *)this_01.descriptor,iVar2);
          EnumDescriptorProto_EnumReservedRange::start
                    ((EnumDescriptorProto_EnumReservedRange *)0x634216);
          strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)this_01.descriptor,iVar2)
          ;
          EnumDescriptorProto_EnumReservedRange::end
                    ((EnumDescriptorProto_EnumReservedRange *)0x63423a);
          strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)this_01.descriptor,iVar2)
          ;
          EnumDescriptorProto_EnumReservedRange::start
                    ((EnumDescriptorProto_EnumReservedRange *)0x63425e);
          strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)this_01.descriptor,iVar2)
          ;
          EnumDescriptorProto_EnumReservedRange::end
                    ((EnumDescriptorProto_EnumReservedRange *)0x634282);
          strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)this_01.descriptor,iVar2)
          ;
          this_00 = local_190;
          strings::internal::SubstituteArg::SubstituteArg(this_00);
          this_01.descriptor = (Descriptor *)local_1c0;
          strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)this_01.descriptor);
          in_stack_fffffffffffff548 = (SubstituteArg *)(local_220 + 0x30);
          strings::internal::SubstituteArg::SubstituteArg(in_stack_fffffffffffff548);
          in_stack_fffffffffffff550 = (DescriptorBuilder *)local_220;
          strings::internal::SubstituteArg::SubstituteArg
                    ((SubstituteArg *)in_stack_fffffffffffff550);
          strings::internal::SubstituteArg::SubstituteArg(&local_250);
          strings::internal::SubstituteArg::SubstituteArg(&local_280);
          in_stack_fffffffffffff620 = in_stack_fffffffffffff550;
          in_stack_fffffffffffff628 = in_stack_fffffffffffff548;
          in_stack_fffffffffffff630 = this_01;
          strings::Substitute_abi_cxx11_
                    ((char *)in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0,
                     (SubstituteArg *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598),
                     (SubstituteArg *)in_stack_fffffffffffff590,
                     (SubstituteArg *)in_stack_fffffffffffff588._M_cur,
                     (SubstituteArg *)CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                     in_stack_fffffffffffff5e8,in_stack_fffffffffffff5f0,
                     (SubstituteArg *)CONCAT17(in_stack_fffffffffffff5ff,in_stack_fffffffffffff5f8),
                     (SubstituteArg *)in_stack_fffffffffffff600._M_cur,
                     (SubstituteArg *)in_stack_fffffffffffff608._M_cur);
          AddError((DescriptorBuilder *)in_stack_fffffffffffff630.descriptor,
                   (string *)in_stack_fffffffffffff628,(Message *)in_stack_fffffffffffff620,
                   in_stack_fffffffffffff61c,(string *)in_stack_fffffffffffff610);
          std::__cxx11::string::~string(local_a0);
        }
      }
    }
  }
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x634421);
  for (local_2cc = 0; iVar2 = local_2cc,
      location = EnumDescriptorProto::reserved_name_size((EnumDescriptorProto *)0x634447),
      iVar2 < (int)location; local_2cc = local_2cc + 1) {
    in_stack_fffffffffffff610 =
         (SubstituteArg *)
         EnumDescriptorProto::reserved_name_abi_cxx11_
                   ((EnumDescriptorProto *)this_01.descriptor,(int)((ulong)this_00 >> 0x20));
    local_2d8 = in_stack_fffffffffffff610;
    in_stack_fffffffffffff608._M_cur =
         (__node_type *)
         std::
         unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_00,(key_type *)0x6344a9);
    local_2e0._M_cur = in_stack_fffffffffffff608._M_cur;
    local_2e8._M_cur =
         (__node_type *)
         std::
         unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this_00);
    bVar1 = std::__detail::operator==(&local_2e0,&local_2e8);
    if (bVar1) {
      pVar10 = std::
               unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::insert((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffff550,(value_type *)in_stack_fffffffffffff548);
      in_stack_fffffffffffff600._M_cur =
           (__node_type *)
           pVar10.first.
           super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ._M_cur;
      in_stack_fffffffffffff5ff = pVar10.second;
      local_2f8._M_cur = in_stack_fffffffffffff600._M_cur;
      local_2f0 = in_stack_fffffffffffff5ff;
    }
    else {
      in_stack_fffffffffffff5e8 = local_2d8;
      in_stack_fffffffffffff5f0 = local_20;
      strings::internal::SubstituteArg::SubstituteArg
                ((SubstituteArg *)this_01.descriptor,(string *)this_00);
      strings::internal::SubstituteArg::SubstituteArg(local_378);
      strings::internal::SubstituteArg::SubstituteArg(&local_3a8);
      strings::internal::SubstituteArg::SubstituteArg(&local_3d8);
      strings::internal::SubstituteArg::SubstituteArg(&local_408);
      strings::internal::SubstituteArg::SubstituteArg(&local_438);
      strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)(local_498 + 0x30));
      strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)local_498);
      strings::internal::SubstituteArg::SubstituteArg(&local_4c8);
      strings::internal::SubstituteArg::SubstituteArg(&local_4f8);
      in_stack_fffffffffffff550 = (DescriptorBuilder *)local_498;
      in_stack_fffffffffffff548 = (SubstituteArg *)(local_498 + 0x30);
      this_01.descriptor = (Descriptor *)&local_438;
      this_00 = &local_408;
      strings::Substitute_abi_cxx11_
                ((char *)in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0,
                 (SubstituteArg *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598),
                 (SubstituteArg *)in_stack_fffffffffffff590,
                 (SubstituteArg *)in_stack_fffffffffffff588._M_cur,
                 (SubstituteArg *)CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                 in_stack_fffffffffffff5e8,in_stack_fffffffffffff5f0,
                 (SubstituteArg *)CONCAT17(in_stack_fffffffffffff5ff,in_stack_fffffffffffff5f8),
                 (SubstituteArg *)in_stack_fffffffffffff600._M_cur,
                 (SubstituteArg *)in_stack_fffffffffffff608._M_cur);
      AddError((DescriptorBuilder *)in_stack_fffffffffffff630.descriptor,
               (string *)in_stack_fffffffffffff628,(Message *)in_stack_fffffffffffff620,location,
               (string *)in_stack_fffffffffffff610);
      std::__cxx11::string::~string(local_318);
    }
  }
  local_4fc = 0;
  while (iVar2 = local_4fc, iVar3 = EnumDescriptor::value_count(local_30), iVar2 < iVar3) {
    local_508 = EnumDescriptor::value(local_30,local_4fc);
    local_50c = 0;
    while (iVar7 = local_50c, iVar6 = EnumDescriptor::reserved_range_count(local_30), iVar7 < iVar6)
    {
      local_518 = EnumDescriptor::reserved_range(local_30,local_50c);
      iVar7 = local_518->start;
      iVar6 = EnumValueDescriptor::number(local_508);
      if ((iVar7 <= iVar6) &&
         (iVar7 = EnumValueDescriptor::number(local_508), iVar7 <= local_518->end)) {
        EnumValueDescriptor::full_name_abi_cxx11_(local_508);
        in_stack_fffffffffffff5a8 =
             EnumDescriptorProto::reserved_range
                       ((EnumDescriptorProto *)this_01.descriptor,(int)((ulong)this_00 >> 0x20));
        in_stack_fffffffffffff5a0 = (SubstituteArg *)EnumValueDescriptor::name_abi_cxx11_(local_508)
        ;
        strings::internal::SubstituteArg::SubstituteArg
                  ((SubstituteArg *)this_01.descriptor,(string *)this_00);
        iVar7 = (int)((ulong)this_00 >> 0x20);
        in_stack_fffffffffffff59c = EnumValueDescriptor::number(local_508);
        strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)this_01.descriptor,iVar7);
        strings::internal::SubstituteArg::SubstituteArg(local_5c8);
        strings::internal::SubstituteArg::SubstituteArg(&local_5f8);
        strings::internal::SubstituteArg::SubstituteArg(&local_628);
        strings::internal::SubstituteArg::SubstituteArg(&local_658);
        strings::internal::SubstituteArg::SubstituteArg(&local_688);
        strings::internal::SubstituteArg::SubstituteArg(&local_6b8);
        strings::internal::SubstituteArg::SubstituteArg(&local_6e8);
        strings::internal::SubstituteArg::SubstituteArg(&local_718);
        this_01.descriptor = (Descriptor *)&local_658;
        this_00 = &local_628;
        strings::Substitute_abi_cxx11_
                  ((char *)in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0,
                   (SubstituteArg *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598),
                   (SubstituteArg *)in_stack_fffffffffffff590,
                   (SubstituteArg *)in_stack_fffffffffffff588._M_cur,
                   (SubstituteArg *)CONCAT44(iVar3,iVar2),in_stack_fffffffffffff5e8,
                   in_stack_fffffffffffff5f0,
                   (SubstituteArg *)CONCAT17(in_stack_fffffffffffff5ff,in_stack_fffffffffffff5f8),
                   (SubstituteArg *)in_stack_fffffffffffff600._M_cur,
                   (SubstituteArg *)in_stack_fffffffffffff608._M_cur);
        AddError((DescriptorBuilder *)in_stack_fffffffffffff630.descriptor,
                 (string *)in_stack_fffffffffffff628,(Message *)in_stack_fffffffffffff620,location,
                 (string *)in_stack_fffffffffffff610);
        std::__cxx11::string::~string(local_538);
      }
      local_50c = local_50c + 1;
    }
    in_stack_fffffffffffff590 = (DescriptorBuilder *)EnumValueDescriptor::name_abi_cxx11_(local_508)
    ;
    in_stack_fffffffffffff588._M_cur =
         (__node_type *)
         std::
         unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_00,(key_type *)0x634a60);
    local_720._M_cur = in_stack_fffffffffffff588._M_cur;
    local_728._M_cur =
         (__node_type *)
         std::
         unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this_00);
    bVar1 = std::__detail::operator!=(&local_720,&local_728);
    if (bVar1) {
      EnumValueDescriptor::full_name_abi_cxx11_(local_508);
      EnumDescriptorProto::value
                ((EnumDescriptorProto *)this_01.descriptor,(int)((ulong)this_00 >> 0x20));
      EnumValueDescriptor::name_abi_cxx11_(local_508);
      strings::internal::SubstituteArg::SubstituteArg
                ((SubstituteArg *)this_01.descriptor,(string *)this_00);
      strings::internal::SubstituteArg::SubstituteArg(local_7a8);
      strings::internal::SubstituteArg::SubstituteArg(&local_7d8);
      strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)&stack0xfffffffffffff7f8);
      strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)&stack0xfffffffffffff7c8);
      strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)local_868);
      strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)&stack0xfffffffffffff768);
      strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)&stack0xfffffffffffff738);
      strings::internal::SubstituteArg::SubstituteArg(&local_8f8);
      strings::internal::SubstituteArg::SubstituteArg(&local_928);
      this_01.descriptor = (Descriptor *)local_868;
      this_00 = (SubstituteArg *)&stack0xfffffffffffff7c8;
      strings::Substitute_abi_cxx11_
                ((char *)in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0,
                 (SubstituteArg *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598),
                 (SubstituteArg *)in_stack_fffffffffffff590,
                 (SubstituteArg *)in_stack_fffffffffffff588._M_cur,
                 (SubstituteArg *)CONCAT44(iVar3,iVar2),in_stack_fffffffffffff5e8,
                 in_stack_fffffffffffff5f0,
                 (SubstituteArg *)CONCAT17(in_stack_fffffffffffff5ff,in_stack_fffffffffffff5f8),
                 (SubstituteArg *)in_stack_fffffffffffff600._M_cur,
                 (SubstituteArg *)in_stack_fffffffffffff608._M_cur);
      AddError((DescriptorBuilder *)in_stack_fffffffffffff630.descriptor,
               (string *)in_stack_fffffffffffff628,(Message *)in_stack_fffffffffffff620,location,
               (string *)in_stack_fffffffffffff610);
      std::__cxx11::string::~string(local_748);
    }
    local_4fc = local_4fc + 1;
  }
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x634c7f);
  return;
}

Assistant:

void DescriptorBuilder::BuildEnum(const EnumDescriptorProto& proto,
                                  const Descriptor* parent,
                                  EnumDescriptor* result) {
  const std::string& scope =
      (parent == nullptr) ? file_->package() : parent->full_name();
  std::string* full_name = AllocateNameString(scope, proto.name());
  ValidateSymbolName(proto.name(), *full_name, proto);

  result->name_ = tables_->AllocateString(proto.name());
  result->full_name_ = full_name;
  result->file_ = file_;
  result->containing_type_ = parent;
  result->is_placeholder_ = false;
  result->is_unqualified_placeholder_ = false;

  if (proto.value_size() == 0) {
    // We cannot allow enums with no values because this would mean there
    // would be no valid default value for fields of this type.
    AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::NAME,
             "Enums must contain at least one value.");
  }

  BUILD_ARRAY(proto, result, value, BuildEnumValue, result);
  BUILD_ARRAY(proto, result, reserved_range, BuildReservedRange, result);

  // Copy reserved names.
  int reserved_name_count = proto.reserved_name_size();
  result->reserved_name_count_ = reserved_name_count;
  result->reserved_names_ =
      tables_->AllocateArray<const std::string*>(reserved_name_count);
  for (int i = 0; i < reserved_name_count; ++i) {
    result->reserved_names_[i] =
        tables_->AllocateString(proto.reserved_name(i));
  }

  CheckEnumValueUniqueness(proto, result);

  // Copy options.
  if (!proto.has_options()) {
    result->options_ = nullptr;  // Will set to default_instance later.
  } else {
    AllocateOptions(proto.options(), result,
                    EnumDescriptorProto::kOptionsFieldNumber);
  }

  AddSymbol(result->full_name(), parent, result->name(), proto, Symbol(result));

  for (int i = 0; i < proto.reserved_range_size(); i++) {
    const EnumDescriptorProto_EnumReservedRange& range1 =
        proto.reserved_range(i);
    for (int j = i + 1; j < proto.reserved_range_size(); j++) {
      const EnumDescriptorProto_EnumReservedRange& range2 =
          proto.reserved_range(j);
      if (range1.end() >= range2.start() && range2.end() >= range1.start()) {
        AddError(result->full_name(), proto.reserved_range(i),
                 DescriptorPool::ErrorCollector::NUMBER,
                 strings::Substitute("Reserved range $0 to $1 overlaps with "
                                     "already-defined range $2 to $3.",
                                     range2.start(), range2.end(),
                                     range1.start(), range1.end()));
      }
    }
  }

  HASH_SET<std::string> reserved_name_set;
  for (int i = 0; i < proto.reserved_name_size(); i++) {
    const std::string& name = proto.reserved_name(i);
    if (reserved_name_set.find(name) == reserved_name_set.end()) {
      reserved_name_set.insert(name);
    } else {
      AddError(name, proto, DescriptorPool::ErrorCollector::NAME,
               strings::Substitute(
                   "Enum value \"$0\" is reserved multiple times.", name));
    }
  }

  for (int i = 0; i < result->value_count(); i++) {
    const EnumValueDescriptor* value = result->value(i);
    for (int j = 0; j < result->reserved_range_count(); j++) {
      const EnumDescriptor::ReservedRange* range = result->reserved_range(j);
      if (range->start <= value->number() && value->number() <= range->end) {
        AddError(
            value->full_name(), proto.reserved_range(j),
            DescriptorPool::ErrorCollector::NUMBER,
            strings::Substitute("Enum value \"$0\" uses reserved number $1.",
                                value->name(), value->number()));
      }
    }
    if (reserved_name_set.find(value->name()) != reserved_name_set.end()) {
      AddError(
          value->full_name(), proto.value(i),
          DescriptorPool::ErrorCollector::NAME,
          strings::Substitute("Enum value \"$0\" is reserved.", value->name()));
    }
  }
}